

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong *in_RDI;
  mz_uint64 rel_ofs_to_zip64_ecdr;
  mz_uint8 hdr [256];
  mz_uint64 central_dir_size;
  mz_uint64 central_dir_ofs;
  mz_zip_internal_state *pState;
  undefined4 local_3b0;
  undefined4 local_3a0;
  undefined2 local_38c;
  undefined2 local_37c;
  undefined1 local_368;
  undefined1 local_367;
  undefined1 local_366;
  undefined1 local_365;
  undefined1 local_364;
  undefined1 local_363;
  undefined1 local_362;
  undefined1 local_361;
  undefined1 local_360;
  undefined1 local_35f;
  undefined1 local_35e;
  undefined1 local_35d;
  undefined1 local_35c;
  undefined1 local_35b;
  undefined1 local_35a;
  undefined1 local_359;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_356;
  undefined1 local_355;
  undefined1 local_350;
  undefined1 local_34f;
  undefined1 local_34e;
  undefined1 local_34d;
  undefined1 local_34c;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  undefined1 local_348;
  undefined1 local_347;
  undefined1 local_346;
  undefined1 local_345;
  undefined1 local_344;
  undefined1 local_343;
  undefined1 local_342;
  undefined1 local_341;
  undefined1 local_340;
  undefined1 local_33f;
  undefined1 local_33e;
  undefined1 local_33d;
  undefined1 local_33c;
  undefined1 local_33b;
  undefined1 local_33a;
  undefined1 local_339;
  undefined1 local_338;
  undefined1 local_337;
  undefined1 local_336;
  undefined1 local_335;
  undefined1 local_334;
  undefined1 local_333;
  undefined1 local_332;
  undefined1 local_331;
  ulong local_260;
  ulong local_258;
  undefined8 *local_250;
  ulong *local_248;
  mz_bool local_240;
  undefined4 local_1bc;
  undefined1 *local_1b8;
  undefined4 local_1ac;
  undefined1 *local_1a8;
  undefined4 local_19c;
  undefined1 *local_198;
  undefined4 local_18c;
  undefined1 *local_188;
  undefined4 local_17c;
  undefined1 *local_178;
  undefined4 local_16c;
  undefined1 *local_168;
  ulong local_160;
  undefined1 *local_158;
  undefined4 local_14c;
  undefined1 *local_148;
  undefined4 local_13c;
  undefined1 *local_138;
  ulong local_130;
  undefined1 *local_128;
  undefined4 local_11c;
  undefined1 *local_118;
  undefined4 local_10c;
  undefined1 *local_108;
  ulong local_100;
  undefined1 *local_f8;
  undefined4 local_ec;
  undefined1 *local_e8;
  undefined4 local_dc;
  undefined1 *local_d8;
  ulong local_d0;
  undefined1 *local_c8;
  undefined4 local_bc;
  undefined1 *local_b8;
  uint local_ac;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 *local_98;
  undefined4 local_8c;
  undefined1 *local_88;
  uint local_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined2 local_3a;
  undefined1 *local_38;
  undefined2 local_2a;
  undefined1 *local_28;
  undefined2 local_1a;
  undefined1 *local_18;
  undefined2 local_a;
  undefined1 *local_8;
  
  if (((in_RDI == (ulong *)0x0) || (in_RDI[0xd] == 0)) || (*(int *)((long)in_RDI + 0x14) != 2)) {
    if (in_RDI != (ulong *)0x0) {
      *(undefined4 *)((long)in_RDI + 0x1c) = 0x18;
    }
    return 0;
  }
  local_250 = (undefined8 *)in_RDI[0xd];
  if (*(int *)((long)local_250 + 100) == 0) {
    if ((0xffff < (uint)in_RDI[2]) || (0xffffffff < *in_RDI + local_250[1] + 0x16)) {
      if (in_RDI != (ulong *)0x0) {
        *(undefined4 *)((long)in_RDI + 0x1c) = 2;
      }
      return 0;
    }
  }
  else if (0xfffffffe < (ulong)local_250[1]) {
    if (in_RDI != (ulong *)0x0) {
      *(undefined4 *)((long)in_RDI + 0x1c) = 2;
    }
    return 0;
  }
  local_258 = 0;
  local_260 = 0;
  local_248 = in_RDI;
  if ((int)in_RDI[2] != 0) {
    local_258 = *in_RDI;
    local_260 = local_250[1];
    in_RDI[1] = local_258;
    uVar2 = (*(code *)in_RDI[10])(in_RDI[0xc],local_258,*local_250,local_260);
    if (uVar2 != local_260) {
      if (local_248 != (ulong *)0x0) {
        *(undefined4 *)((long)local_248 + 0x1c) = 0x13;
      }
      return 0;
    }
    *local_248 = local_260 + *local_248;
  }
  if (*(int *)((long)local_250 + 100) != 0) {
    uVar2 = *local_248;
    memset(&local_368,0,0x100);
    local_168 = &local_368;
    local_16c = 0x6064b50;
    local_368 = 0x50;
    local_367 = 0x4b;
    local_366 = 6;
    local_365 = 6;
    local_68 = &local_364;
    local_70 = 0x2c;
    local_4c = 0x2c;
    local_364 = 0x2c;
    local_363 = 0;
    local_362 = 0;
    local_361 = 0;
    local_58 = &local_360;
    local_5c = 0;
    local_8 = &local_35c;
    local_a = 0x31e;
    local_35c = 0x1e;
    local_35b = 3;
    local_18 = &local_35a;
    local_1a = 0x2d;
    local_35a = 0x2d;
    local_359 = 0;
    local_98 = &local_350;
    local_7c = (uint)local_248[2];
    local_a0 = (ulong)local_7c;
    local_350 = (undefined1)local_7c;
    local_34f = (undefined1)(local_7c >> 8);
    local_34e = (undefined1)(local_7c >> 0x10);
    local_34d = (undefined1)(local_7c >> 0x18);
    local_88 = &local_34c;
    local_8c = 0;
    local_34c = 0;
    local_34b = 0;
    local_34a = 0;
    local_349 = 0;
    local_c8 = &local_348;
    local_ac = (uint)local_248[2];
    local_d0 = (ulong)local_ac;
    local_348 = (undefined1)local_ac;
    local_347 = (undefined1)(local_ac >> 8);
    local_346 = (undefined1)(local_ac >> 0x10);
    local_345 = (undefined1)(local_ac >> 0x18);
    local_b8 = &local_344;
    local_bc = 0;
    local_344 = 0;
    local_343 = 0;
    local_342 = 0;
    local_341 = 0;
    local_f8 = &local_340;
    local_100 = local_260;
    local_dc = (undefined4)local_260;
    local_340 = (undefined1)local_260;
    local_33f = (undefined1)(local_260 >> 8);
    local_33e = (undefined1)(local_260 >> 0x10);
    local_33d = (undefined1)(local_260 >> 0x18);
    local_e8 = &local_33c;
    local_ec = (undefined4)(local_260 >> 0x20);
    local_33c = (undefined1)(local_260 >> 0x20);
    local_33b = (undefined1)(local_260 >> 0x28);
    local_33a = (undefined1)(local_260 >> 0x30);
    local_339 = (undefined1)(local_260 >> 0x38);
    local_128 = &local_338;
    local_130 = local_258;
    local_10c = (undefined4)local_258;
    local_338 = (undefined1)local_258;
    local_337 = (undefined1)(local_258 >> 8);
    local_336 = (undefined1)(local_258 >> 0x10);
    local_335 = (undefined1)(local_258 >> 0x18);
    local_118 = &local_334;
    local_11c = (undefined4)(local_258 >> 0x20);
    local_334 = (undefined1)(local_258 >> 0x20);
    local_333 = (undefined1)(local_258 >> 0x28);
    local_332 = (undefined1)(local_258 >> 0x30);
    local_331 = (undefined1)(local_258 >> 0x38);
    local_108 = local_128;
    local_d8 = local_f8;
    local_a8 = local_c8;
    local_78 = local_98;
    local_48 = local_68;
    lVar3 = (*(code *)local_248[10])(local_248[0xc],*local_248,&local_368,0x38);
    if (lVar3 != 0x38) {
      if (local_248 != (ulong *)0x0) {
        *(undefined4 *)((long)local_248 + 0x1c) = 0x13;
      }
      return 0;
    }
    *local_248 = *local_248 + 0x38;
    memset(&local_368,0,0x100);
    local_178 = &local_368;
    local_17c = 0x7064b50;
    local_368 = 0x50;
    local_367 = 0x4b;
    local_366 = 6;
    local_365 = 7;
    local_158 = &local_360;
    local_13c = (undefined4)uVar2;
    local_360 = (undefined1)uVar2;
    local_35f = (undefined1)(uVar2 >> 8);
    local_148 = &local_35c;
    local_14c = (undefined4)(uVar2 >> 0x20);
    local_35c = (undefined1)(uVar2 >> 0x20);
    local_35b = (undefined1)(uVar2 >> 0x28);
    local_35a = (undefined1)(uVar2 >> 0x30);
    local_359 = (undefined1)(uVar2 >> 0x38);
    local_188 = &local_358;
    local_18c = 1;
    local_358 = 1;
    local_357 = 0;
    local_356 = 0;
    local_355 = 0;
    local_160 = uVar2;
    local_138 = local_158;
    lVar3 = (*(code *)local_248[10])(local_248[0xc],*local_248,&local_368,0x14);
    if (lVar3 != 0x14) {
      if (local_248 != (ulong *)0x0) {
        *(undefined4 *)((long)local_248 + 0x1c) = 0x13;
      }
      return 0;
    }
    *local_248 = *local_248 + 0x14;
  }
  memset(&local_368,0,0x100);
  local_198 = &local_368;
  local_19c = 0x6054b50;
  local_368 = 0x50;
  local_367 = 0x4b;
  local_366 = 5;
  local_365 = 6;
  local_28 = &local_360;
  if ((uint)local_248[2] < 0x10000) {
    local_37c = (undefined2)(int)local_248[2];
  }
  else {
    local_37c = 0xffff;
  }
  local_2a = local_37c;
  local_360 = (undefined1)local_37c;
  local_35f = (undefined1)((ushort)local_37c >> 8);
  local_38 = &local_35e;
  if ((uint)local_248[2] < 0x10000) {
    local_38c = (undefined2)(int)local_248[2];
  }
  else {
    local_38c = 0xffff;
  }
  local_3a = local_38c;
  local_35e = (undefined1)local_38c;
  local_35d = (undefined1)((ushort)local_38c >> 8);
  local_1a8 = &local_35c;
  if (local_260 < 0x100000000) {
    local_3a0 = (undefined4)local_260;
  }
  else {
    local_3a0 = 0xffffffff;
  }
  local_1ac = local_3a0;
  local_35c = (undefined1)local_3a0;
  local_35b = (undefined1)((uint)local_3a0 >> 8);
  local_35a = (undefined1)((uint)local_3a0 >> 0x10);
  local_359 = (undefined1)((uint)local_3a0 >> 0x18);
  local_1b8 = &local_358;
  if (local_258 < 0x100000000) {
    local_3b0 = (undefined4)local_258;
  }
  else {
    local_3b0 = 0xffffffff;
  }
  local_1bc = local_3b0;
  local_358 = (undefined1)local_3b0;
  local_357 = (undefined1)((uint)local_3b0 >> 8);
  local_356 = (undefined1)((uint)local_3b0 >> 0x10);
  local_355 = (undefined1)((uint)local_3b0 >> 0x18);
  lVar3 = (*(code *)local_248[10])(local_248[0xc],*local_248,&local_368,0x16);
  if (lVar3 == 0x16) {
    if ((local_250[0xe] == 0) || (iVar1 = fflush((FILE *)local_250[0xe]), iVar1 != -1)) {
      *local_248 = *local_248 + 0x16;
      *(undefined4 *)((long)local_248 + 0x14) = 3;
      local_240 = 1;
    }
    else {
      if (local_248 != (ulong *)0x0) {
        *(undefined4 *)((long)local_248 + 0x1c) = 0x15;
      }
      local_240 = 0;
    }
  }
  else {
    if (local_248 != (ulong *)0x0) {
      *(undefined4 *)((long)local_248 + 0x1c) = 0x13;
    }
    local_240 = 0;
  }
  return local_240;
}

Assistant:

inline mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState;
    mz_uint64 central_dir_ofs, central_dir_size;
    mz_uint8 hdr[256];

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if ((pZip->m_total_files > MZ_UINT32_MAX) || (pState->m_central_dir.m_size >= MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if ((pZip->m_total_files > MZ_UINT16_MAX)
                || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
                        > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    central_dir_ofs = 0;
    central_dir_size = 0;
    if (pZip->m_total_files) {
        /* Write central directory */
        central_dir_ofs = pZip->m_archive_size;
        central_dir_size = pState->m_central_dir.m_size;
        pZip->m_central_directory_file_ofs = central_dir_ofs;
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           central_dir_ofs,
                           pState->m_central_dir.m_p,
                           (size_t)central_dir_size) != central_dir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += central_dir_size;
    }

    if (pState->m_zip64) {
        /* Write zip64 end of central directory header */
        mz_uint64 rel_ofs_to_zip64_ecdr = pZip->m_archive_size;

        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDH_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - sizeof(mz_uint32) - sizeof(mz_uint64));
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_MADE_BY_OFS, 0x031E); /* TODO: always Unix */
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_NEEDED_OFS, 0x002D);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_SIZE_OFS, central_dir_size);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_OFS_OFS, central_dir_ofs);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

        /* Write zip64 end of central directory locator */
        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS, rel_ofs_to_zip64_ecdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS, 1);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
    }

    /* Write end of central directory record */
    MZ_CLEAR_OBJ(hdr);
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_size));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_ofs));

    if (pZip->m_pWrite(pZip->m_pIO_opaque,
                       pZip->m_archive_size,
                       hdr,
                       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

#ifndef MINIZ_NO_STDIO
    if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);
#endif /* #ifndef MINIZ_NO_STDIO */

    pZip->m_archive_size += MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE;

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return MZ_TRUE;
}